

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<CodePointerAlias,_CodePointerAlias>::ShrinkToFit
          (TArray<CodePointerAlias,_CodePointerAlias> *this)

{
  TArray<CodePointerAlias,_CodePointerAlias> *this_local;
  
  if (this->Count < this->Most) {
    this->Most = this->Count;
    if (this->Most == 0) {
      if (this->Array != (CodePointerAlias *)0x0) {
        M_Free(this->Array);
        this->Array = (CodePointerAlias *)0x0;
      }
    }
    else {
      DoResize(this);
    }
  }
  return;
}

Assistant:

void ShrinkToFit ()
	{
		if (Most > Count)
		{
			Most = Count;
			if (Most == 0)
			{
				if (Array != NULL)
				{
					M_Free (Array);
					Array = NULL;
				}
			}
			else
			{
				DoResize ();
			}
		}
	}